

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsParseDuplicateHeaderException * __thiscall
BmsParseDuplicateHeaderException::Message_abi_cxx11_(BmsParseDuplicateHeaderException *this)

{
  ostream *poVar1;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsParseDuplicateHeaderException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,anon_var_dwarf_2c365);
  std::operator<<(poVar1,(string *)(in_RSI + 0x10));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsParseDuplicateHeaderException::Message( void ) const
{
  std::stringstream os;
  os << "ヘッダが複数回指定されました。ヘッダ : " << header_;
  return os.str();
}